

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::filter_and_chain_matches_by_offset_group
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches,
          bool verbose)

{
  int iVar1;
  int iVar2;
  LongReadMapping *pLVar3;
  pointer pLVar4;
  iterator __position;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined3 uVar9;
  int32_t iVar10;
  bool bVar11;
  undefined3 uVar12;
  int32_t iVar13;
  iterator iVar14;
  _Bit_iterator_base _Var15;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *this_00;
  match_band *m_1;
  ostream *poVar16;
  pointer pmVar17;
  long *plVar18;
  int32_t *piVar19;
  pointer pLVar20;
  undefined7 in_register_00000009;
  ulong uVar21;
  _Bit_type *p_Var22;
  _Bit_type *p_Var23;
  match_band *mb;
  int iVar24;
  char *pcVar25;
  size_type __n;
  int iVar26;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> __i;
  pointer pmVar27;
  long lVar28;
  pointer pmVar29;
  match_band *m_2;
  ulong uVar30;
  undefined1 auVar31 [8];
  LongReadMapping *m;
  LongReadMapping *pLVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  vector<match_band,_std::allocator<match_band>_> filtered_mbo;
  vector<match_band,_std::allocator<match_band>_> mbo;
  vector<bool,_std::allocator<bool>_> used;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *filtered_matches;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  bool local_dd;
  int local_dc;
  undefined1 local_d8 [8];
  iterator iStack_d0;
  match_band *local_c8;
  vector<match_band,_std::allocator<match_band>_> local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  int iStack_80;
  int iStack_7c;
  _Bit_pointer local_78;
  match_band local_68;
  vector<LongReadMapping,std::allocator<LongReadMapping>> *local_48;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_40;
  float local_34;
  
  local_dc = (int)CONCAT71(in_register_00000009,verbose);
  local_48 = (vector<LongReadMapping,std::allocator<LongReadMapping>> *)__return_storage_ptr__;
  local_40 = matches;
  if (local_dc != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtering matches:",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pLVar3 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pLVar32 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)
                   ._M_impl.super__Vector_impl_data._M_start; pLVar32 != pLVar3;
        pLVar32 = pLVar32 + 1) {
      poVar16 = ::operator<<((ostream *)&std::cout,pLVar32);
      std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
    }
  }
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar20 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  lVar33 = pLVar20->node;
  lVar28 = -lVar33;
  if (0 < lVar33) {
    lVar28 = lVar33;
  }
  if (pLVar20 != pLVar4) {
    do {
      local_dd = lVar28 == pLVar20->node;
      local_98._0_4_ = pLVar20->qStart - pLVar20->nStart;
      local_d8._0_4_ = pLVar20->qEnd - pLVar20->nEnd;
      local_68._0_4_ = pLVar20->nEnd - pLVar20->nStart;
      std::vector<match_band,std::allocator<match_band>>::emplace_back<bool,int,int,int,int_const&>
                ((vector<match_band,std::allocator<match_band>> *)&local_b8,&local_dd,
                 (int *)local_98,(int *)local_d8,(int *)&local_68,&pLVar20->score);
      pLVar20 = pLVar20 + 1;
    } while (pLVar20 != pLVar4);
  }
  for (pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pmVar17 !=
      local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_finish; pmVar17 = pmVar17 + 1) {
    iVar35 = pmVar17->min_offset;
    iVar24 = pmVar17->max_offset;
    iVar26 = iVar35;
    if (iVar24 < iVar35) {
      iVar26 = iVar24;
    }
    if (iVar24 < iVar35) {
      iVar24 = iVar35;
    }
    pmVar17->min_offset = iVar26 + -200;
    pmVar17->max_offset = iVar24 + 200;
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Orientations, offsets, lengths and scores:",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar17 != pmVar29; pmVar17 = pmVar17 + 1) {
      pcVar25 = "false";
      if ((ulong)pmVar17->dir != 0) {
        pcVar25 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar25,(ulong)pmVar17->dir ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(&std::cout,pmVar17->min_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,pmVar17->max_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,pmVar17->len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar16,pmVar17->score);
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  lVar33 = (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                 super__Vector_impl_data._M_start;
  __n = (lVar33 >> 2) * -0x3333333333333333;
  pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_start;
  pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__n < __n + 1) {
    do {
      auVar7[0xf] = 0;
      auVar7._0_15_ = stack0xffffffffffffff29;
      _local_d8 = auVar7 << 8;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_98,__n,(bool *)local_d8,
                 (allocator_type *)&local_68);
      uVar30 = ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      _local_d8 = (undefined1  [16])0x0;
      local_c8 = (match_band *)0x0;
      if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar34 = 0;
        do {
          if ((*(ulong *)(local_98._0_8_ + (uVar34 >> 6) * 8) >> (uVar34 & 0x3f) & 1) == 0) {
            *(ulong *)(local_98._0_8_ + (uVar34 >> 6) * 8) =
                 *(ulong *)(local_98._0_8_ + (uVar34 >> 6) * 8) | 1L << ((byte)uVar34 & 0x3f);
            pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar34;
            uVar5._0_1_ = pmVar17->dir;
            uVar5._1_3_ = *(undefined3 *)&pmVar17->field_0x1;
            uVar5._4_4_ = pmVar17->min_offset;
            uVar6._0_4_ = pmVar17->max_offset;
            uVar6._4_4_ = pmVar17->len;
            iVar35 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar34].score;
            piVar19 = &(local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl
                        .super__Vector_impl_data._M_start)->len;
            uVar21 = 0;
            local_68._0_8_ = uVar5;
            local_68._8_8_ = uVar6;
            local_68.score = iVar35;
            do {
              if ((((*(ulong *)(local_98._0_8_ + (uVar21 >> 6) * 8) >> (uVar21 & 0x3f) & 1) == 0) &&
                  (iVar24 = piVar19[-1], uVar5._4_4_ < iVar24)) &&
                 (iVar26 = piVar19[-2], iVar26 < (int32_t)uVar6)) {
                if (iVar26 < uVar5._4_4_) {
                  uVar5._4_4_ = iVar26;
                }
                if ((int32_t)uVar6 <= iVar24) {
                  uVar6._0_4_ = iVar24;
                }
                local_68.min_offset = uVar5._4_4_;
                uVar6._4_4_ = uVar6._4_4_ + (int)*(undefined8 *)piVar19;
                iVar35 = iVar35 + (int)((ulong)*(undefined8 *)piVar19 >> 0x20);
                local_68.len = uVar6._4_4_;
                local_68.max_offset = (int32_t)uVar6;
                *(ulong *)(local_98._0_8_ + (uVar21 >> 6) * 8) =
                     *(ulong *)(local_98._0_8_ + (uVar21 >> 6) * 8) | 1L << ((byte)uVar21 & 0x3f);
                local_68.score = iVar35;
              }
              uVar21 = uVar21 + 1;
              piVar19 = piVar19 + 5;
            } while (uVar30 + (uVar30 == 0) != uVar21);
            if (iStack_d0._M_current == local_c8) {
              std::vector<match_band,std::allocator<match_band>>::_M_realloc_insert<match_band&>
                        ((vector<match_band,std::allocator<match_band>> *)local_d8,iStack_d0,
                         &local_68);
            }
            else {
              (iStack_d0._M_current)->score = local_68.score;
              (iStack_d0._M_current)->dir = local_68.dir;
              *(undefined3 *)&(iStack_d0._M_current)->field_0x1 = local_68._1_3_;
              (iStack_d0._M_current)->min_offset = local_68.min_offset;
              (iStack_d0._M_current)->max_offset = local_68.max_offset;
              (iStack_d0._M_current)->len = local_68.len;
              iStack_d0._M_current = iStack_d0._M_current + 1;
            }
          }
          uVar34 = uVar34 + 1;
          uVar30 = ((long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar34 <= uVar30 && uVar30 - uVar34 != 0);
      }
      std::vector<match_band,_std::allocator<match_band>_>::operator=
                (&local_b8,(vector<match_band,_std::allocator<match_band>_> *)local_d8);
      if (local_d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
      }
      if ((_Bit_type *)local_98._0_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_98._0_8_,(long)local_78 - local_98._0_8_);
        local_98._0_12_ = ZEXT812(0);
        _local_88 = ZEXT812(0);
        local_78 = (_Bit_pointer)0x0;
      }
      lVar33 = (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                     super__Vector_impl_data._M_start;
      __n = (lVar33 >> 2) * -0x3333333333333333;
      pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                super__Vector_impl_data._M_start;
      pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (__n < uVar30);
  }
  if (pmVar17 != pmVar29) {
    lVar28 = 0x3f;
    if (__n != 0) {
      for (; __n >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
              (pmVar17,pmVar29,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar33 < 0x141) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar17,pmVar29);
    }
    else {
      pmVar27 = pmVar17 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,__gnu_cxx::__ops::_Iter_comp_iter<LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>>
                (pmVar17,pmVar27);
      for (; pmVar27 != pmVar29; pmVar27 = pmVar27 + 1) {
        bVar11 = pmVar27->dir;
        uVar12 = *(undefined3 *)&pmVar27->field_0x1;
        iVar13 = pmVar27->min_offset;
        uVar5 = *(undefined8 *)&pmVar27->max_offset;
        local_98 = pmVar27->dir;
        iVar24 = pmVar27->score;
        iVar35 = pmVar27[-1].score;
        pmVar17 = pmVar27;
        while (iVar35 < iVar24) {
          pmVar17->score = pmVar17[-1].score;
          uVar9 = *(undefined3 *)&pmVar17[-1].field_0x1;
          iVar10 = pmVar17[-1].min_offset;
          uVar6 = *(undefined8 *)&pmVar17[-1].max_offset;
          pmVar17->dir = pmVar17[-1].dir;
          *(undefined3 *)&pmVar17->field_0x1 = uVar9;
          pmVar17->min_offset = iVar10;
          *(undefined8 *)&pmVar17->max_offset = uVar6;
          iVar35 = pmVar17[-2].score;
          pmVar17 = pmVar17 + -1;
        }
        pmVar17->dir = bVar11;
        *(undefined3 *)&pmVar17->field_0x1 = uVar12;
        pmVar17->min_offset = iVar13;
        *(undefined8 *)&pmVar17->max_offset = uVar5;
        pmVar17->score = iVar24;
      }
    }
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Consolidated orientations, offsets, lengths and scores:\n",
               0x38);
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                   super__Vector_impl_data._M_start; pmVar17 != pmVar29; pmVar17 = pmVar17 + 1) {
      pcVar25 = "false";
      if ((ulong)pmVar17->dir != 0) {
        pcVar25 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar25,(ulong)pmVar17->dir ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(&std::cout,pmVar17->min_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,pmVar17->max_offset);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,pmVar17->len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar16,pmVar17->score);
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  _local_d8 = (undefined1  [16])0x0;
  local_c8 = (match_band *)0x0;
  pmVar17 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_34 = (float)(local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                       super__Vector_impl_data._M_start)->score * 0.5;
    pmVar29 = local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (local_34 <= (float)pmVar29->score) {
        if (iStack_d0._M_current == local_c8) {
          std::vector<match_band,std::allocator<match_band>>::_M_realloc_insert<match_band_const&>
                    ((vector<match_band,std::allocator<match_band>> *)local_d8,iStack_d0,pmVar29);
        }
        else {
          (iStack_d0._M_current)->score = pmVar29->score;
          uVar12 = *(undefined3 *)&pmVar29->field_0x1;
          uVar5._4_4_ = pmVar29->min_offset;
          uVar6._0_4_ = pmVar29->max_offset;
          uVar6._4_4_ = pmVar29->len;
          (iStack_d0._M_current)->dir = pmVar29->dir;
          *(undefined3 *)&(iStack_d0._M_current)->field_0x1 = uVar12;
          (iStack_d0._M_current)->min_offset = uVar5._4_4_;
          (iStack_d0._M_current)->max_offset = (int32_t)uVar6;
          (iStack_d0._M_current)->len = uVar6._4_4_;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
      }
      pmVar29 = pmVar29 + 1;
    } while (pmVar29 != pmVar17);
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtered orientations, offsets, lengths and scores:\n",0x34);
    iVar14._M_current = iStack_d0._M_current;
    for (auVar31 = local_d8; auVar31 != (undefined1  [8])iVar14._M_current;
        auVar31 = (undefined1  [8])((long)auVar31 + 0x14)) {
      pcVar25 = "false";
      if ((ulong)*(byte *)auVar31 != 0) {
        pcVar25 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar25,(ulong)*(byte *)auVar31 ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)((long)auVar31 + 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,*(int *)((long)auVar31 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,*(int *)((long)auVar31 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      plVar18 = (long *)std::ostream::operator<<(poVar16,*(int *)((long)auVar31 + 0x10));
      std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
      std::ostream::put((char)plVar18);
      std::ostream::flush();
    }
  }
  this_00 = local_48;
  *(undefined1 (*) [16])local_48 = (undefined1  [16])0x0;
  *(undefined8 *)(local_48 + 0x10) = 0;
  iVar14._M_current = iStack_d0._M_current;
  if (local_d8 != (undefined1  [8])iStack_d0._M_current) {
    auVar31 = local_d8;
    do {
      stack0xffffffffffffff7c = SUB1612((undefined1  [16])0x0,4);
      local_88._0_4_ = 0x80000000;
      iStack_7c = 0;
      _Var15 = _local_88;
      pLVar20 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                _M_impl.super__Vector_impl_data._M_start;
      auVar8._4_8_ = 0;
      auVar8._0_4_ = pLVar20->read_id;
      local_98._0_12_ = auVar8 << 0x40;
      local_98._12_4_ = 0x7fffffff;
      p_Var22 = (_Bit_type *)pLVar20->node;
      p_Var23 = (_Bit_type *)-(long)p_Var22;
      if (0 < (long)p_Var22) {
        p_Var23 = p_Var22;
      }
      p_Var22 = (_Bit_type *)-(long)p_Var23;
      if (*(char *)auVar31 != '\0') {
        p_Var22 = p_Var23;
      }
      local_98._0_8_ = p_Var22;
      auVar7 = local_98;
      pLVar4 = (local_40->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pLVar20 != pLVar4) {
        iStack_7c = 0;
        local_98._12_4_ = 0x7fffffff;
        local_88._0_4_ = -0x80000000;
        iVar35 = iStack_7c;
        iVar24 = local_98._12_4_;
        iVar26 = local_88._0_4_;
        local_98 = auVar7;
        _local_88 = _Var15;
        do {
          iVar1 = pLVar20->nStart;
          if (*(int *)((long)auVar31 + 4) <= pLVar20->qStart - iVar1) {
            iVar2 = pLVar20->nEnd;
            if (pLVar20->qEnd - iVar2 <= *(int *)((long)auVar31 + 8)) {
              if (iVar1 < iVar24) {
                local_98._12_4_ = iVar1;
                local_88._4_4_ = pLVar20->qStart;
                iVar24 = iVar1;
              }
              if (iVar26 < iVar2) {
                local_88._0_4_ = iVar2;
                iStack_80 = pLVar20->qEnd;
                iVar26 = iVar2;
              }
              iVar35 = iVar35 + pLVar20->score;
              iStack_7c = iVar35;
            }
          }
          pLVar20 = pLVar20 + 1;
        } while (pLVar20 != pLVar4);
      }
      _Var15 = _local_88;
      auVar7 = local_98;
      __position._M_current = *(LongReadMapping **)(this_00 + 8);
      if (__position._M_current == *(LongReadMapping **)(this_00 + 0x10)) {
        std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
        _M_realloc_insert<LongReadMapping&>(this_00,__position,(LongReadMapping *)local_98);
      }
      else {
        (__position._M_current)->nEnd = local_88._0_4_;
        (__position._M_current)->qStart = local_88._4_4_;
        (__position._M_current)->qEnd = iStack_80;
        (__position._M_current)->score = iStack_7c;
        (__position._M_current)->node = local_98._0_8_;
        (__position._M_current)->read_id = local_98._8_4_;
        (__position._M_current)->nStart = local_98._12_4_;
        *(LongReadMapping **)(this_00 + 8) = __position._M_current + 1;
        local_98 = auVar7;
        _local_88 = _Var15;
      }
      auVar31 = (undefined1  [8])((long)auVar31 + 0x14);
    } while (auVar31 != (undefined1  [8])iVar14._M_current);
  }
  if ((char)local_dc != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Filtered matches:",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pLVar3 = *(LongReadMapping **)(this_00 + 8);
    for (pLVar32 = *(LongReadMapping **)this_00; pLVar32 != pLVar3; pLVar32 = pLVar32 + 1) {
      poVar16 = ::operator<<((ostream *)&std::cout,pLVar32);
      std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
    }
  }
  if (local_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<match_band,_std::allocator<match_band>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)this_00;
}

Assistant:

std::vector<LongReadMapping>
LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping> &matches, bool verbose) const {

    const int32_t OFFSET_BANDWITDH=200;
    if (verbose){
        std::cout<<"Filtering matches:" << std::endl;
        for (const auto &m : matches)
            std::cout << m << std::endl;
    }


    std::vector<match_band> mbo;
    auto node = std::abs(matches[0].node);
    for (const auto &m : matches ){
        mbo.emplace_back(node == m.node, m.qStart-m.nStart, m.qEnd-m.nEnd, m.nEnd-m.nStart, m.score);
    }

    for (auto &m : mbo) {
        auto mino=std::min(m.min_offset,m.max_offset)-OFFSET_BANDWITDH;
        auto maxo=std::max(m.min_offset, m.max_offset)+OFFSET_BANDWITDH;
        m.min_offset = mino;
        m.max_offset = maxo;
    }

    if (verbose){
        std::cout << "Orientations, offsets, lengths and scores:" << std::endl;
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    auto prev_len = mbo.size()+1;

    while (mbo.size() < prev_len) {
        auto used = std::vector<bool>(mbo.size(), false);
        std::vector<match_band> new_mbo;

        for (int mi=0; mi < mbo.size(); mi++) {
            if (used[mi]){continue;}
            used[mi] = true;
            auto m = mbo[mi];
            for (int mi2 = 0; mi2 < mbo.size(); mi2++) {
                if (used[mi2]){continue;}
                auto m2 = mbo[mi2];
                if (m.min_offset<m2.max_offset and m2.min_offset < m.max_offset){
                    m.min_offset = std::min(m.min_offset,m2.min_offset);
                    m.max_offset = std::max(m.max_offset,m2.max_offset);
                    m.len += m2.len;
                    m.score += m2.score;
                    used[mi2] = true;
                }
            }
            new_mbo.emplace_back(m);
        }
        prev_len = mbo.size();
        mbo = new_mbo;
    }

    std::sort(mbo.begin(), mbo.end(), [](match_band &ma, match_band &mb){return ma.score > mb.score;});

    if (verbose){
        std::cout << "Consolidated orientations, offsets, lengths and scores:\n";
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    std::vector<match_band> filtered_mbo;
    auto max_score = mbo[0].score;
    std::copy_if(mbo.begin(), mbo.end(), std::back_inserter(filtered_mbo), [max_score](match_band &m){ return m.score >= 0.5f*max_score; });

    if (verbose){
        std::cout << "Filtered orientations, offsets, lengths and scores:\n";
        for (const auto &m : filtered_mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    // Create matches min, max positions for each band that has passed the filter
    std::vector<LongReadMapping> filtered_matches;

    for (const auto &mb : filtered_mbo) {
        LongReadMapping chained;
        chained.nStart=INT32_MAX;
        chained.nEnd=INT32_MIN;
        chained.score=0;
        chained.read_id=matches[0].read_id;
        chained.node=mb.dir ? std::abs(matches[0].node) : -std::abs(matches[0].node);
        for (const auto &m : matches) {
            if ((m.qStart - m.nStart) >= mb.min_offset and (m.qEnd - m.nEnd) <= mb.max_offset) {
                if (chained.nStart>m.nStart){
                    chained.nStart=m.nStart;
                    chained.qStart=m.qStart;
                }
                if (chained.nEnd<m.nEnd){
                    chained.nEnd=m.nEnd;
                    chained.qEnd=m.qEnd;
                }
                chained.score+=m.score;
            }
        }
        filtered_matches.emplace_back(chained);
    }

    if (verbose){
        std::cout<<"Filtered matches:" << std::endl;
        for (const auto &m : filtered_matches)
            std::cout << m << std::endl;
    }

    return filtered_matches;
}